

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifarg(bifcxdef *ctx,int argc)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 in_ESI;
  long in_RDI;
  int argnum;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
            (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  }
  uVar2 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  iVar3 = (int)uVar2;
  if (iVar3 < 1) {
    *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "getarg";
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
    runsign((runcxdef *)CONCAT44(in_ESI,iVar3),(int)((ulong)uVar2 >> 0x20));
  }
  runrepush(*(runcxdef **)(in_RDI + 8),
            (runsdef *)(*(long *)(*(long *)(in_RDI + 8) + 0x28) + (long)iVar3 * -0x10 + -0x10));
  return;
}

Assistant:

void bifarg(bifcxdef *ctx, int argc)
{
    int argnum;
    
    bifcntargs(ctx, 1, argc);
    bifchkarg(ctx, DAT_NUMBER);
    
    /* get and verify argument number */
    argnum = runpopnum(ctx->bifcxrun);
    if (argnum < 1) runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "getarg");

    runrepush(ctx->bifcxrun, ctx->bifcxrun->runcxbp - argnum - 1);
}